

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O3

void __thiscall
Assimp::ObjFileImporter::createVertexArray
          (ObjFileImporter *this,Model *pModel,Object *pCurrentObject,uint uiMeshIndex,aiMesh *pMesh
          ,uint numIndices)

{
  size_t __n;
  float fVar1;
  Mesh *pMVar2;
  Face *pFVar3;
  pointer paVar4;
  pointer paVar5;
  long lVar6;
  aiVector3D *paVar7;
  aiFace *paVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  uint uVar12;
  aiVector3D *paVar13;
  aiColor4D *paVar14;
  ulong uVar15;
  runtime_error *prVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  pointer ppFVar22;
  long lVar23;
  pointer ppFVar24;
  pointer puVar25;
  ulong uVar26;
  size_t i;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  ulong local_38;
  
  if (pCurrentObject == (Object *)0x0) {
    __assert_fail("__null != pCurrentObject",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Obj/ObjFileImporter.cpp"
                  ,0x19a,
                  "void Assimp::ObjFileImporter::createVertexArray(const ObjFile::Model *, const ObjFile::Object *, unsigned int, aiMesh *, unsigned int)"
                 );
  }
  if ((pCurrentObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (pCurrentObject->m_Meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pMVar2 = (pModel->m_Meshes).
             super__Vector_base<Assimp::ObjFile::Mesh_*,_std::allocator<Assimp::ObjFile::Mesh_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uiMeshIndex];
    if ((pMVar2 != (Mesh *)0x0) && (pMVar2->m_uiNumIndices != 0)) {
      pMesh->mNumVertices = numIndices;
      if (numIndices == 0) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"OBJ: no vertices","");
        std::runtime_error::runtime_error(prVar16,(string *)local_58);
        *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((int)numIndices < 0) {
        prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_58,"OBJ: Too many vertices","");
        std::runtime_error::runtime_error(prVar16,(string *)local_58);
        *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar15 = (ulong)numIndices;
      uVar20 = uVar15 * 0xc;
      paVar13 = (aiVector3D *)operator_new__(uVar20);
      __n = ((uVar15 * 0xc - 0xc) / 0xc) * 0xc + 0xc;
      memset(paVar13,0,__n);
      pMesh->mVertices = paVar13;
      if (((pModel->m_Normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (pModel->m_Normals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish) && (pMVar2->m_hasNormals == true)) {
        paVar13 = (aiVector3D *)operator_new__(uVar20);
        memset(paVar13,0,__n);
        pMesh->mNormals = paVar13;
      }
      if ((pModel->m_VertexColors).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pModel->m_VertexColors).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar14 = (aiColor4D *)operator_new__(uVar15 << 4);
        memset(paVar14,0,uVar15 << 4);
        pMesh->mColors[0] = paVar14;
      }
      if (((pModel->m_TextureCoord).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (pModel->m_TextureCoord).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish) && (pMVar2->m_uiUVCoordinates[0] != 0)) {
        pMesh->mNumUVComponents[0] = pModel->m_TextureCoordDim;
        paVar13 = (aiVector3D *)operator_new__(uVar20);
        memset(paVar13,0,__n);
        pMesh->mTextureCoords[0] = paVar13;
      }
      ppFVar22 = (pMVar2->m_Faces).
                 super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar24 = *(pointer *)
                  ((long)&(pMVar2->m_Faces).
                          super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                          ._M_impl + 8);
      if (ppFVar24 != ppFVar22) {
        uVar15 = 0;
        bVar9 = true;
        bVar10 = true;
        uVar17 = 0;
        uVar20 = 0;
        do {
          local_38 = uVar20;
          pFVar3 = ppFVar22[local_38];
          puVar25 = (pFVar3->m_vertices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (*(pointer *)
               ((long)&(pFVar3->m_vertices).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)
              != puVar25) {
            lVar23 = 0;
            uVar21 = 0;
            uVar20 = uVar17;
            do {
              uVar12 = (uint)uVar15;
              uVar17 = (ulong)puVar25[uVar21];
              paVar4 = (pModel->m_Vertices).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar26 = ((long)(pModel->m_Vertices).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 2) *
                       -0x5555555555555555;
              if (uVar26 < uVar17 || uVar26 - uVar17 == 0) {
                prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_58[0] = local_48;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_58,"OBJ: vertex index out of range","");
                std::runtime_error::runtime_error(prVar16,(string *)local_58);
                *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              if (pMesh->mNumVertices <= uVar12) {
                prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_58[0] = local_48;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_58,"OBJ: bad vertex index","");
                std::runtime_error::runtime_error(prVar16,(string *)local_58);
                *(undefined ***)prVar16 = &PTR__runtime_error_0080bf48;
                __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              paVar13 = pMesh->mVertices;
              paVar13[uVar15].z = paVar4[uVar17].z;
              fVar1 = paVar4[uVar17].y;
              paVar13 = paVar13 + uVar15;
              paVar13->x = paVar4[uVar17].x;
              paVar13->y = fVar1;
              if (bVar9) {
                paVar4 = (pModel->m_Normals).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                paVar5 = (pModel->m_Normals).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                if ((paVar4 != paVar5) &&
                   (lVar6 = *(long *)&(pFVar3->m_normals).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data,
                   uVar21 < (ulong)((long)*(pointer *)
                                           ((long)&(pFVar3->m_normals).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) - lVar6 >> 2))) {
                  uVar18 = (ulong)*(uint *)(lVar6 + uVar21 * 4);
                  uVar26 = ((long)paVar5 - (long)paVar4 >> 2) * -0x5555555555555555;
                  if (uVar26 < uVar18 || uVar26 - uVar18 == 0) {
                    bVar9 = false;
                  }
                  else {
                    paVar13 = pMesh->mNormals;
                    paVar13[uVar15].z = paVar4[uVar18].z;
                    fVar1 = paVar4[uVar18].y;
                    paVar13 = paVar13 + uVar15;
                    paVar13->x = paVar4[uVar18].x;
                    paVar13->y = fVar1;
                  }
                }
              }
              paVar4 = (pModel->m_VertexColors).
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if (paVar4 != (pModel->m_VertexColors).
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                fVar1 = paVar4[uVar17].z;
                paVar14 = pMesh->mColors[0];
                fVar11 = paVar4[uVar17].y;
                paVar14[uVar15].r = paVar4[uVar17].x;
                paVar14[uVar15].g = fVar11;
                paVar14[uVar15].b = fVar1;
                paVar14[uVar15].a = 1.0;
              }
              if (bVar10) {
                paVar4 = (pModel->m_TextureCoord).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                paVar5 = (pModel->m_TextureCoord).
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
                if ((paVar4 != paVar5) &&
                   (lVar6 = *(long *)&(pFVar3->m_texturCoords).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data,
                   uVar21 < (ulong)((long)*(pointer *)
                                           ((long)&(pFVar3->m_texturCoords).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) - lVar6 >> 2))) {
                  uVar26 = (ulong)*(uint *)(lVar6 + uVar21 * 4);
                  uVar17 = ((long)paVar5 - (long)paVar4 >> 2) * -0x5555555555555555;
                  if (uVar17 < uVar26 || uVar17 - uVar26 == 0) {
                    bVar10 = false;
                  }
                  else {
                    fVar1 = paVar4[uVar26].z;
                    paVar7 = pMesh->mTextureCoords[0];
                    fVar11 = paVar4[uVar26].y;
                    paVar13 = paVar7 + uVar15;
                    paVar13->x = paVar4[uVar26].x;
                    paVar13->y = fVar11;
                    paVar7[uVar15].z = fVar1;
                  }
                }
              }
              iVar19 = (int)uVar20;
              uVar26 = ((long)*(pointer *)
                               ((long)&(pFVar3->m_vertices).
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl + 8) -
                        *(long *)&(pFVar3->m_vertices).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data >> 2) - 1;
              paVar8 = pMesh->mFaces;
              if ((pFVar3->m_PrimitiveType == aiPrimitiveType_LINE) && (uVar21 == uVar26)) {
LAB_00497427:
                uVar17 = (ulong)(iVar19 + (uint)(uVar21 != uVar26));
                if (uVar21 != 0) {
                  if (uVar21 != uVar26) {
                    paVar13 = pMesh->mVertices;
                    uVar12 = uVar12 + 1;
                    paVar13[uVar12].z = paVar13[uVar15].z;
                    fVar1 = paVar13[uVar15].y;
                    paVar13[uVar12].x = paVar13[uVar15].x;
                    paVar13[uVar12].y = fVar1;
                    if (((pFVar3->m_normals).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start !=
                         *(pointer *)
                          ((long)&(pFVar3->m_normals).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + 8)) &&
                       ((pModel->m_Normals).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start !=
                        (pModel->m_Normals).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish)) {
                      paVar13 = pMesh->mNormals;
                      paVar13[uVar12].z = paVar13[uVar15].z;
                      fVar1 = paVar13[uVar15].y;
                      paVar13[uVar12].x = paVar13[uVar15].x;
                      paVar13[uVar12].y = fVar1;
                    }
                    if ((pModel->m_TextureCoord).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_start !=
                        (pModel->m_TextureCoord).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
                      uVar26 = 0;
                      do {
                        uVar18 = 0;
                        do {
                          if (pMesh->mTextureCoords[uVar18] == (aiVector3D *)0x0) goto LAB_004974ba;
                          uVar18 = uVar18 + 1;
                        } while (uVar18 != 8);
                        uVar18 = 8;
LAB_004974ba:
                        if (uVar18 <= uVar26) break;
                        paVar13 = pMesh->mTextureCoords[uVar26];
                        paVar13[uVar12].z = paVar13[uVar15].z;
                        fVar1 = paVar13[uVar15].y;
                        paVar13[uVar12].x = paVar13[uVar15].x;
                        paVar13[uVar12].y = fVar1;
                        uVar26 = uVar26 + 1;
                      } while( true );
                    }
                  }
                  paVar8[uVar20 - 1].mIndices[1] = uVar12;
                }
LAB_004974e2:
                lVar23 = 0;
              }
              else {
                paVar8[uVar20].mIndices[lVar23] = uVar12;
                if (pFVar3->m_PrimitiveType == aiPrimitiveType_LINE) goto LAB_00497427;
                if (pFVar3->m_PrimitiveType == aiPrimitiveType_POINT) {
                  uVar17 = (ulong)(iVar19 + 1);
                  goto LAB_004974e2;
                }
                lVar23 = lVar23 + 1;
                uVar17 = (ulong)(iVar19 + (uint)(uVar21 == uVar26));
              }
              uVar15 = (ulong)(uVar12 + 1);
              uVar21 = uVar21 + 1;
              puVar25 = (pFVar3->m_vertices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar20 = uVar17;
            } while (uVar21 < (ulong)((long)*(pointer *)
                                             ((long)&(pFVar3->m_vertices).
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) - (long)puVar25 >> 2));
            ppFVar22 = (pMVar2->m_Faces).
                       super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppFVar24 = *(pointer *)
                        ((long)&(pMVar2->m_Faces).
                                super__Vector_base<Assimp::ObjFile::Face_*,_std::allocator<Assimp::ObjFile::Face_*>_>
                                ._M_impl + 8);
          }
          uVar20 = local_38 + 1;
        } while (local_38 + 1 < (ulong)((long)ppFVar24 - (long)ppFVar22 >> 3));
        if (!bVar9) {
          if (pMesh->mNormals != (aiVector3D *)0x0) {
            operator_delete__(pMesh->mNormals);
          }
          pMesh->mNormals = (aiVector3D *)0x0;
        }
        if (!bVar10) {
          if (pMesh->mTextureCoords[0] != (aiVector3D *)0x0) {
            operator_delete__(pMesh->mTextureCoords[0]);
          }
          pMesh->mTextureCoords[0] = (aiVector3D *)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void ObjFileImporter::createVertexArray(const ObjFile::Model* pModel,
                                        const ObjFile::Object* pCurrentObject,
                                        unsigned int uiMeshIndex,
                                        aiMesh* pMesh,
                                        unsigned int numIndices) {
    // Checking preconditions
    ai_assert( NULL != pCurrentObject );

    // Break, if no faces are stored in object
    if ( pCurrentObject->m_Meshes.empty() )
        return;

    // Get current mesh
    ObjFile::Mesh *pObjMesh = pModel->m_Meshes[ uiMeshIndex ];
    if ( NULL == pObjMesh || pObjMesh->m_uiNumIndices < 1 ) {
        return;
    }

    // Copy vertices of this mesh instance
    pMesh->mNumVertices = numIndices;
    if (pMesh->mNumVertices == 0) {
        throw DeadlyImportError( "OBJ: no vertices" );
    } else if (pMesh->mNumVertices > AI_MAX_VERTICES) {
        throw DeadlyImportError( "OBJ: Too many vertices" );
    }
    pMesh->mVertices = new aiVector3D[ pMesh->mNumVertices ];

    // Allocate buffer for normal vectors
    if ( !pModel->m_Normals.empty() && pObjMesh->m_hasNormals )
        pMesh->mNormals = new aiVector3D[ pMesh->mNumVertices ];

    // Allocate buffer for vertex-color vectors
    if ( !pModel->m_VertexColors.empty() )
        pMesh->mColors[0] = new aiColor4D[ pMesh->mNumVertices ];

    // Allocate buffer for texture coordinates
    if ( !pModel->m_TextureCoord.empty() && pObjMesh->m_uiUVCoordinates[0] )
    {
        pMesh->mNumUVComponents[ 0 ] = pModel->m_TextureCoordDim;
        pMesh->mTextureCoords[ 0 ] = new aiVector3D[ pMesh->mNumVertices ];
    }

    // Copy vertices, normals and textures into aiMesh instance
    bool normalsok = true, uvok = true;
    unsigned int newIndex = 0, outIndex = 0;
    for ( size_t index=0; index < pObjMesh->m_Faces.size(); index++ ) {
        // Get source face
        ObjFile::Face *pSourceFace = pObjMesh->m_Faces[ index ];

        // Copy all index arrays
        for ( size_t vertexIndex = 0, outVertexIndex = 0; vertexIndex < pSourceFace->m_vertices.size(); vertexIndex++ ) {
            const unsigned int vertex = pSourceFace->m_vertices.at( vertexIndex );
            if ( vertex >= pModel->m_Vertices.size() ) {
                throw DeadlyImportError( "OBJ: vertex index out of range" );
            }

            if ( pMesh->mNumVertices <= newIndex ) {
                throw DeadlyImportError("OBJ: bad vertex index");
            }

            pMesh->mVertices[ newIndex ] = pModel->m_Vertices[ vertex ];

            // Copy all normals
            if ( normalsok && !pModel->m_Normals.empty() && vertexIndex < pSourceFace->m_normals.size()) {
                const unsigned int normal = pSourceFace->m_normals.at( vertexIndex );
                if ( normal >= pModel->m_Normals.size() )
                {
                    normalsok = false;
                }
                else
                {
                    pMesh->mNormals[ newIndex ] = pModel->m_Normals[ normal ];
                }
            }

            // Copy all vertex colors
            if ( !pModel->m_VertexColors.empty())
            {
                const aiVector3D& color = pModel->m_VertexColors[ vertex ];
                pMesh->mColors[0][ newIndex ] = aiColor4D(color.x, color.y, color.z, 1.0);
            }

            // Copy all texture coordinates
            if ( uvok && !pModel->m_TextureCoord.empty() && vertexIndex < pSourceFace->m_texturCoords.size())
            {
                const unsigned int tex = pSourceFace->m_texturCoords.at( vertexIndex );

                if ( tex >= pModel->m_TextureCoord.size() )
                {
                    uvok = false;
                }
                else
                {
                    const aiVector3D &coord3d = pModel->m_TextureCoord[ tex ];
                    pMesh->mTextureCoords[ 0 ][ newIndex ] = aiVector3D( coord3d.x, coord3d.y, coord3d.z );
                }
            }

            // Get destination face
            aiFace *pDestFace = &pMesh->mFaces[ outIndex ];

            const bool last = ( vertexIndex == pSourceFace->m_vertices.size() - 1 );
            if (pSourceFace->m_PrimitiveType != aiPrimitiveType_LINE || !last) {
                pDestFace->mIndices[ outVertexIndex ] = newIndex;
                outVertexIndex++;
            }

            if (pSourceFace->m_PrimitiveType == aiPrimitiveType_POINT) {
                outIndex++;
                outVertexIndex = 0;
            } else if (pSourceFace->m_PrimitiveType == aiPrimitiveType_LINE) {
                outVertexIndex = 0;

                if(!last)
                    outIndex++;

                if (vertexIndex) {
                    if(!last) {
                        pMesh->mVertices[ newIndex+1 ] = pMesh->mVertices[ newIndex ];
                        if ( !pSourceFace->m_normals.empty() && !pModel->m_Normals.empty()) {
                            pMesh->mNormals[ newIndex+1 ] = pMesh->mNormals[newIndex ];
                        }
                        if ( !pModel->m_TextureCoord.empty() ) {
                            for ( size_t i=0; i < pMesh->GetNumUVChannels(); i++ ) {
                                pMesh->mTextureCoords[ i ][ newIndex+1 ] = pMesh->mTextureCoords[ i ][ newIndex ];
                            }
                        }
                        ++newIndex;
                    }

                    pDestFace[-1].mIndices[1] = newIndex;
                }
            }
            else if (last) {
                outIndex++;
            }
            ++newIndex;
        }
    }

    if (!normalsok)
    {
        delete [] pMesh->mNormals;
        pMesh->mNormals = nullptr;
    }

    if (!uvok)
    {
        delete [] pMesh->mTextureCoords[0];
        pMesh->mTextureCoords[0] = nullptr;
    }
}